

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tally.cpp
# Opt level: O2

TallyState * __thiscall ccs::TallyState::activate(TallyState *this,Node *leg,Specificity *spec)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int in_ECX;
  void *in_R8;
  TallyState *pTVar3;
  
  iVar2 = clone(this,(__fn *)leg,spec,in_ECX,in_R8);
  pTVar3 = (TallyState *)CONCAT44(extraout_var,iVar2);
  if ((this->tally->super_Tally).firstLeg_ == leg) {
    pTVar3->firstMatched = true;
    bVar1 = Specificity::operator<(&pTVar3->firstMatch,spec);
    if (bVar1) {
      pTVar3->firstMatch = *spec;
    }
  }
  if ((this->tally->super_Tally).secondLeg_ == leg) {
    pTVar3->secondMatched = true;
    bVar1 = Specificity::operator<(&pTVar3->secondMatch,spec);
    if (bVar1) {
      pTVar3->secondMatch = *spec;
    }
  }
  return pTVar3;
}

Assistant:

TallyState *TallyState::activate(const Node &leg,
    const Specificity &spec) const {
  // NB reference equality in the below...
  TallyState *next = clone();
  if (&tally.firstLeg_ == &leg) {
    next->firstMatched = true;
    if (next->firstMatch < spec) next->firstMatch = spec;
  }
  if (&tally.secondLeg_ == &leg) {
    next->secondMatched = true;
    if (next->secondMatch < spec) next->secondMatch = spec;
  }
  return next;
}